

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDtdPtr xmlSAXParseDTD(xmlSAXHandlerPtr sax,xmlChar *ExternalID,xmlChar *SystemID)

{
  resolveEntitySAXFunc p_Var1;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar2;
  xmlParserInputPtr input;
  xmlDtdPtr pxVar3;
  
  if ((ExternalID != (xmlChar *)0x0 || SystemID != (xmlChar *)0x0) &&
     (ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0), ctxt != (xmlParserCtxtPtr)0x0)) {
    xmlCtxtSetOptions(ctxt,4);
    pxVar2 = xmlCanonicPath(SystemID);
    if (pxVar2 == (xmlChar *)0x0 && SystemID != (xmlChar *)0x0) {
      xmlFreeParserCtxt(ctxt);
    }
    else {
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var1 = ctxt->sax->resolveEntity, p_Var1 != (resolveEntitySAXFunc)0x0)) &&
         (input = (*p_Var1)(ctxt->userData,ExternalID,pxVar2), input != (xmlParserInputPtr)0x0)) {
        if (input->filename == (char *)0x0) {
          input->filename = (char *)pxVar2;
        }
        else {
          (*xmlFree)(pxVar2);
        }
        pxVar3 = xmlCtxtParseDtd(ctxt,input,ExternalID,SystemID);
        xmlFreeParserCtxt(ctxt);
        return pxVar3;
      }
      xmlFreeParserCtxt(ctxt);
      if (pxVar2 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar2);
      }
    }
  }
  return (xmlDtdPtr)0x0;
}

Assistant:

xmlDtdPtr
xmlSAXParseDTD(xmlSAXHandlerPtr sax, const xmlChar *ExternalID,
                          const xmlChar *SystemID) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input = NULL;
    xmlChar* systemIdCanonic;

    if ((ExternalID == NULL) && (SystemID == NULL)) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
	return(NULL);
    }
    xmlCtxtSetOptions(ctxt, XML_PARSE_DTDLOAD);

    /*
     * Canonicalise the system ID
     */
    systemIdCanonic = xmlCanonicPath(SystemID);
    if ((SystemID != NULL) && (systemIdCanonic == NULL)) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    /*
     * Ask the Entity resolver to load the damn thing
     */

    if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                 systemIdCanonic);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }

    if (input->filename == NULL)
	input->filename = (char *) systemIdCanonic;
    else
	xmlFree(systemIdCanonic);

    ret = xmlCtxtParseDtd(ctxt, input, ExternalID, SystemID);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}